

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall helics::Publication::publish(Publication *this,Time val)

{
  bool bVar1;
  data_view *in_RDI;
  SmallBuffer db;
  int64_t in_stack_000000d0;
  bool doPublish;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 uVar2;
  double in_stack_ffffffffffffff28;
  defV *in_stack_ffffffffffffff30;
  Time in_stack_ffffffffffffff38;
  Publication *in_stack_ffffffffffffff48;
  ValueFederate *in_stack_ffffffffffffff50;
  SmallBuffer local_a8;
  baseType local_28;
  byte local_11;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  local_11 = in_RDI[1].ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (((ulong)in_RDI[2].ref.
              super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi & 0x100000000) != 0) {
    bVar1 = changeDetected(in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                           in_stack_ffffffffffffff28);
    if (bVar1) {
      local_28 = TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(&local_8);
      std::
      variant<double,long,std::__cxx11::string,std::complex<double>,std::vector<double,std::allocator<double>>,std::vector<std::complex<double>,std::allocator<std::complex<double>>>,helics::NamedPoint>
      ::operator=((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                   *)in_RDI,(long *)in_stack_ffffffffffffff38.internalTimeCode);
    }
    else {
      local_11 = 0;
    }
  }
  if ((local_11 & 1) != 0) {
    uVar2 = *(undefined4 *)
             &in_RDI[2].ref.
              super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    TimeRepresentation<count_time<9,_long>_>::getBaseTimeCode(&local_8);
    typeConvert(this._4_4_,in_stack_000000d0);
    data_view::data_view(in_RDI,&local_a8);
    helics::ValueFederate::publishBytes(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_RDI);
    data_view::~data_view((data_view *)0x3acb76);
    SmallBuffer::~SmallBuffer((SmallBuffer *)CONCAT44(uVar2,in_stack_ffffffffffffff20));
  }
  return;
}

Assistant:

void Publication::publish(Time val)
{
    bool doPublish = (fed != nullptr);
    if (changeDetectionEnabled) {
        if (changeDetected(prevValue, val, delta)) {
            prevValue = val.getBaseTimeCode();
        } else {
            doPublish = false;
        }
    }
    if (doPublish) {
        auto db = typeConvert(pubType, val.getBaseTimeCode());
        fed->publishBytes(*this, db);
    }
}